

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupRepres(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int iVar6;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  iVar6 = p->nBarBufs;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = iVar6;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar4 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar4;
  }
  Aig_ManCleanData(p);
  iVar6 = 0;
  do {
    if (p->vObjs->nSize <= iVar6) {
      Aig_ManSetRegNum(p_00,p->nRegs);
      iVar6 = Aig_ManCheck(p_00);
      if (iVar6 == 0) {
        puts("Aig_ManDupRepres: Check has failed.");
      }
      return p_00;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar6);
    if (pObj != (Aig_Obj_t *)0x0) {
      uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
      if ((uVar1 & 7) - 7 < 0xfffffffe) {
        uVar1 = uVar1 & 7;
        if (uVar1 == 3) {
          pAVar5 = Aig_ObjChild0Repres(p,pObj);
          pAVar5 = Aig_ObjCreateCo(p_00,pAVar5);
        }
        else if (uVar1 == 2) {
          pAVar5 = Aig_ObjCreateCi(p_00);
          (pObj->field_5).pData = pAVar5;
          pAVar5 = Aig_ObjGetRepres(p,pObj);
        }
        else {
          iVar2 = Aig_ObjIsConst1(pObj);
          if (iVar2 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                          ,0x3b5,"Aig_Man_t *Aig_ManDupRepres(Aig_Man_t *)");
          }
          pAVar5 = p_00->pConst1;
        }
      }
      else {
        pAVar5 = Aig_ObjChild0Repres(p,pObj);
        p1 = Aig_ObjChild1Repres(p,pObj);
        pAVar5 = Aig_And(p_00,pAVar5,p1);
      }
      (pObj->field_5).pData = pAVar5;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManDupRepres( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // start the HOP package
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Repres(p, pObj), Aig_ObjChild1Repres(p, pObj) );
        else if ( Aig_ObjIsCi(pObj) )
        {
            pObj->pData = Aig_ObjCreateCi(pNew);
            pObj->pData = Aig_ObjGetRepres( p, pObj );
        }
        else if ( Aig_ObjIsCo(pObj) )
            pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Repres(p, pObj) );
        else if ( Aig_ObjIsConst1(pObj) )
            pObj->pData = Aig_ManConst1(pNew);
        else
            assert( 0 );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the new manager
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupRepres: Check has failed.\n" );
    return pNew;
}